

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListEntryArray.cpp
# Opt level: O1

void __thiscall DestListEntryArray::printDestListEntryArray(DestListEntryArray *this)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_______________________DestList__________________________",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  if ((this->destListEntryArray).
      super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->destListEntryArray).
      super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0x150;
    uVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DestListEntry ",0xe)
      ;
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      uVar6 = uVar6 + 1;
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar6);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Checksum:                         ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_48,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x150));
      Utils::print_vec(&local_48);
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  VolumeId:                         ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_60,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x138));
      Utils::printSid(&local_60,0);
      if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  ObjectId:                         ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_78,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x120));
      Utils::printSid(&local_78,0);
      if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"     Birth Mac:                     ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_90,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x120));
      Utils::printMacAddr(&local_90,0);
      if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"     Sequence Number:               ",0x24);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_a8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x120));
      iVar1 = Utils::lenTwoBytesFromPos(&local_a8,8);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  BirthVolumeId:                    ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_c0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x108));
      Utils::printSid(&local_c0,0);
      if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  BirthObjectId:                    ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_d8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0xf0));
      Utils::printSid(&local_d8,0);
      if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  NetBIOSName:                      ",0x24);
      Utils::print_vec_unicode
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0xd8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  EntryId:                          ",0x24);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_f0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0xc0));
      Utils::lenFourBytes(&local_f0);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_f0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Reserved1:                        ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_108,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0xa8));
      Utils::print_vec(&local_108);
      if (local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  MSFileTime:                       ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_120,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x90));
      Utils::getDateFromPos(&local_120,0);
      if (local_120.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_120.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                          Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," Time of last recorded access.",0x1e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  EntryPinStatus:                   ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_138,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x78));
      Utils::print_vec(&local_138);
      if (local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Reserved2:                        ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_150,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x60));
      Utils::print_vec(&local_150);
      if (local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_150.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  AccessedCount:                    ",0x24);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_168,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x48));
      Utils::lenFourBytes(&local_168);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Reserved3:                        ",0x24);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_180,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x30));
      Utils::print_vec(&local_180);
      if (local_180.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_180.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_180.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  LengthOfUnicodeData:              ",0x24);
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_198,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)(this->destListEntryArray).
                        super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x18));
      iVar1 = Utils::lenTwoBytes(&local_198);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1 * 2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," bytes",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_198.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_198.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  EntryStringData:                  ",0x24);
      Utils::print_vec_unicode
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(((this->destListEntryArray).
                           super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start)->Checksum).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar5));
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      uVar4 = ((long)(this->destListEntryArray).
                     super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->destListEntryArray).
                     super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fa4fa4fa4fa4fa5;
      lVar5 = lVar5 + 0x168;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_________________________________________________________",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return;
}

Assistant:

void DestListEntryArray::printDestListEntryArray() {
    cout << "_______________________DestList__________________________" << endl;
    for(int i = 0; i < destListEntryArray.size(); ++i) {
        cout << "DestListEntry " << dec << i + 1 << endl;
        cout << "  Checksum:                         "; Utils::print_vec(destListEntryArray[i].Checksum);
        cout << "  VolumeId:                         "; Utils::printSid(destListEntryArray[i].VolumeId, 0); cout << endl;
        cout << "  ObjectId:                         "; Utils::printSid(destListEntryArray[i].ObjectId, 0); cout << endl;
        cout << "     Birth Mac:                     "; Utils::printMacAddr(destListEntryArray[i].ObjectId, 0);

        cout << "     Sequence Number:               " <<
            dec << Utils::lenTwoBytesFromPos(destListEntryArray[i].ObjectId, 8) << endl;
//        cout << "     Creation Date:                 "; Utils::getDateFromPos(destListEntryArray[i].ObjectId, 0);
        cout << "  BirthVolumeId:                    "; Utils::printSid(destListEntryArray[i].BirthVolumeId, 0); cout << endl;
        cout << "  BirthObjectId:                    "; Utils::printSid(destListEntryArray[i].BirthObjectId, 0); cout << endl;
        cout << "  NetBIOSName:                      "; Utils::print_vec_unicode(destListEntryArray[i].NetBIOSName);
        cout << "  EntryId:                          " << dec << Utils::lenFourBytes(destListEntryArray[i].EntryId) << endl;
        cout << "  Reserved1:                        "; Utils::print_vec(destListEntryArray[i].Reserved1);
        cout << "  MSFileTime:                       "; Utils::getDateFromPos(destListEntryArray[i].MSFileTime, 0);
            cout << Utils::defaultOffsetDocInfo << " Time of last recorded access." << endl;
        cout << "  EntryPinStatus:                   "; Utils::print_vec(destListEntryArray[i].EntryPinStatus);
        cout << "  Reserved2:                        "; Utils::print_vec(destListEntryArray[i].Reserved2);
        cout << "  AccessedCount:                    " << dec << Utils::lenFourBytes(destListEntryArray[i].AccessedCount) << endl;
        cout << "  Reserved3:                        "; Utils::print_vec(destListEntryArray[i].Reserved3);
        cout << "  LengthOfUnicodeData:              "<< dec <<
            2 * Utils::lenTwoBytes(destListEntryArray[i].LengthOfUnicodeData) << " bytes" << endl;
        cout << "  EntryStringData:                  "; Utils::print_vec_unicode(destListEntryArray[i].EntryStringData);
        cout << endl;
    }
    cout << "_________________________________________________________" << endl;
}